

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

MemberSyntax * __thiscall
slang::parsing::Parser::parseSingleMember(Parser *this,SyntaxKind parentKind)

{
  SyntaxNode *pSVar1;
  ulong in_RAX;
  MemberSyntax *member;
  bool anyLocalModules;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  member = parseMember(this,parentKind,(bool *)((long)&uStack_28 + 7));
  if (uStack_28._7_1_ == '\x01') {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  if (member != (MemberSyntax *)0x0) {
    checkMemberAllowed(this,&member->super_SyntaxNode,parentKind);
    pSVar1 = this->previewNode;
    this->previewNode = (SyntaxNode *)0x0;
    (member->super_SyntaxNode).previewNode = pSVar1;
  }
  return member;
}

Assistant:

MemberSyntax* Parser::parseSingleMember(SyntaxKind parentKind) {
    bool anyLocalModules = false;
    auto result = parseMember(parentKind, anyLocalModules);
    if (anyLocalModules)
        moduleDeclStack.pop_back();

    if (result) {
        checkMemberAllowed(*result, parentKind);
        result->previewNode = std::exchange(previewNode, nullptr);
    }

    return result;
}